

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

void DoExtension(gif_source_ptr sinfo)

{
  int iVar1;
  long in_RDI;
  int extlabel;
  gif_source_ptr in_stack_000000e0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = ReadByte((gif_source_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined4 *)(**(long **)(in_RDI + 0x30) + 0x28) = 0x3fe;
  *(int *)(**(long **)(in_RDI + 0x30) + 0x2c) = iVar1;
  (**(code **)(**(long **)(in_RDI + 0x30) + 8))(*(undefined8 *)(in_RDI + 0x30),1);
  SkipDataBlocks(in_stack_000000e0);
  return;
}

Assistant:

LOCAL(void)
DoExtension(gif_source_ptr sinfo)
/* Process an extension block */
/* Currently we ignore 'em all */
{
  int extlabel;

  /* Read extension label byte */
  extlabel = ReadByte(sinfo);
  TRACEMS1(sinfo->cinfo, 1, JTRC_GIF_EXTENSION, extlabel);
  /* Skip the data block(s) associated with the extension */
  SkipDataBlocks(sinfo);
}